

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_decompress.cc
# Opt level: O1

int main(int argc,char **argv)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  char *__value;
  string input;
  string outfilename;
  string output;
  string filename;
  WOFF2StringOut out;
  uchar *local_328;
  ulong local_320;
  uchar local_318 [16];
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  char *local_2e8 [2];
  char local_2d8 [16];
  char *local_2c8 [2];
  char local_2b8 [16];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_2a8;
  char *local_298 [2];
  char local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  WOFF2StringOut local_258 [24];
  long local_240;
  undefined1 *local_238;
  filebuf local_230 [8];
  undefined1 local_228 [232];
  ios_base local_140 [272];
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_278,argv[1],(allocator *)&local_238);
    std::__cxx11::string::find_last_of((char *)&local_278,0x103039,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_278);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_2f8 = *plVar6;
      lStack_2f0 = plVar4[3];
      local_308 = &local_2f8;
    }
    else {
      local_2f8 = *plVar6;
      local_308 = (long *)*plVar4;
    }
    local_300 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_238 != local_228) {
      operator_delete(local_238);
    }
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>((string *)local_298,local_278,local_278 + local_270);
    std::ifstream::ifstream(&local_238,local_298[0],_S_bin);
    local_328 = local_318;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_328,local_228,0xffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&local_238);
    if (local_298[0] != local_288) {
      operator_delete(local_298[0]);
    }
    puVar1 = local_328;
    uVar5 = woff2::ComputeWOFF2FinalSize(local_328,local_320);
    uVar7 = 0;
    if (uVar5 < 0x1e00000) {
      uVar7 = uVar5;
    }
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct((ulong)local_2c8,(char)uVar7);
    woff2::WOFF2StringOut::WOFF2StringOut(local_258,(string *)local_2c8);
    bVar2 = woff2::ConvertWOFF2ToTTF(puVar1,local_320,(WOFF2Out *)local_258);
    if (bVar2 != 0) {
      local_2e8[0] = local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,local_308,local_300 + (long)local_308);
      __value = local_2c8[0];
      std::ofstream::ofstream((ostream_type *)&local_238,local_2e8[0],_S_bin);
      local_2a8._M_string = (char *)0x0;
      local_2a8._M_stream = (ostream_type *)&local_238;
      if (0 < local_240) {
        lVar8 = local_240 + 1;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_2a8,__value);
          __value = __value + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      local_238 = _VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18) + -8) = _operator_delete;
      std::filebuf::~filebuf(local_230);
      std::ios_base::~ios_base(local_140);
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0]);
      }
    }
    if (local_2c8[0] != local_2b8) {
      operator_delete(local_2c8[0]);
    }
    if (local_328 != local_318) {
      operator_delete(local_328);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308);
    }
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
    uVar3 = (uint)(bVar2 ^ 1);
  }
  else {
    main_cold_1();
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".ttf";

  // Note: update woff2_dec_fuzzer_new_entry.cc if this pattern changes.
  string input = woff2::GetFileContent(filename);
  const uint8_t* raw_input = reinterpret_cast<const uint8_t*>(input.data());
  string output(std::min(woff2::ComputeWOFF2FinalSize(raw_input, input.size()),
                         woff2::kDefaultMaxSize), 0);
  woff2::WOFF2StringOut out(&output);

  const bool ok = woff2::ConvertWOFF2ToTTF(raw_input, input.size(), &out);

  if (ok) {
    woff2::SetFileContents(outfilename, output.begin(),
        output.begin() + out.Size());
  }
  return ok ? 0 : 1;
}